

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString VStringFromFormat(char *format,__va_list_tag *args)

{
  int iVar1;
  undefined8 *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  SimpleString SVar3;
  SimpleString local_f8;
  char *local_e8;
  char *newBuffer;
  size_t newBufferSize;
  ulong local_b8;
  size_t size;
  char local_a8 [8];
  char defaultBuffer [100];
  undefined1 auStack_38 [8];
  va_list argsCopy;
  __va_list_tag *args_local;
  char *format_local;
  SimpleString *resultString;
  
  argsCopy[0].overflow_arg_area = (void *)in_RDX[2];
  auStack_38 = (undefined1  [8])*in_RDX;
  argsCopy[0]._0_8_ = in_RDX[1];
  size._7_1_ = 0;
  argsCopy[0].reg_save_area = in_RDX;
  SimpleString::SimpleString((SimpleString *)format,"");
  iVar1 = (*PlatformSpecificVSNprintf)
                    (local_a8,100,(char *)args,(__va_list_tag *)argsCopy[0].reg_save_area);
  local_b8 = (ulong)iVar1;
  if (local_b8 < 100) {
    SimpleString::SimpleString((SimpleString *)&newBufferSize,local_a8);
    SimpleString::operator=((SimpleString *)format,(SimpleString *)&newBufferSize);
    SimpleString::~SimpleString((SimpleString *)&newBufferSize);
    sVar2 = extraout_RDX;
  }
  else {
    newBuffer = (char *)(local_b8 + 1);
    local_e8 = SimpleString::allocStringBuffer
                         ((size_t)newBuffer,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
                          ,0x3c3);
    (*PlatformSpecificVSNprintf)
              (local_e8,(size_t)newBuffer,(char *)args,(__va_list_tag *)auStack_38);
    SimpleString::SimpleString(&local_f8,local_e8);
    SimpleString::operator=((SimpleString *)format,&local_f8);
    SimpleString::~SimpleString(&local_f8);
    SimpleString::deallocStringBuffer
              (local_e8,(size_t)newBuffer,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
               ,0x3c7);
    sVar2 = extraout_RDX_00;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = format;
  return SVar3;
}

Assistant:

SimpleString VStringFromFormat(const char* format, va_list args)
{
    va_list argsCopy;
    va_copy(argsCopy, args);
    enum
    {
        sizeOfdefaultBuffer = 100
    };
    char defaultBuffer[sizeOfdefaultBuffer];
    SimpleString resultString;

    size_t size = (size_t)PlatformSpecificVSNprintf(defaultBuffer, sizeOfdefaultBuffer, format, args);
    if (size < sizeOfdefaultBuffer) {
        resultString = SimpleString(defaultBuffer);
    }
    else {
        size_t newBufferSize = size + 1;
        char* newBuffer = SimpleString::allocStringBuffer(newBufferSize, __FILE__, __LINE__);
        PlatformSpecificVSNprintf(newBuffer, newBufferSize, format, argsCopy);
        resultString = SimpleString(newBuffer);

        SimpleString::deallocStringBuffer(newBuffer, newBufferSize, __FILE__, __LINE__);
    }
    va_end(argsCopy);
    return resultString;
}